

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pset_io.c
# Opt level: O0

pset_t * read_pset_file(char *file_name,acmod_set_t *acmod_set,uint32 *n_pset)

{
  uint32 uVar1;
  int32 iVar2;
  uint uVar3;
  acmod_id_t aVar4;
  int iVar5;
  FILE *__stream;
  void *pvVar6;
  char *pcVar7;
  char *phone;
  uint32 n_ci;
  pset_t *out;
  uint32 p;
  uint32 n_phone;
  uint32 lc;
  uint32 j;
  uint32 i;
  lineiter_t *li;
  FILE *fp;
  uint32 *n_pset_local;
  acmod_set_t *acmod_set_local;
  char *file_name_local;
  
  __stream = fopen(file_name,"r");
  if (__stream == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/pset_io.c"
                   ,0x4a,"Unable to open %s",file_name);
    file_name_local = (char *)0x0;
  }
  else {
    p = 0;
    _j = lineiter_start((FILE *)__stream);
    while (_j != (lineiter_t *)0x0) {
      _j = lineiter_next(_j);
      p = p + 1;
    }
    file_name_local =
         (char *)__ckd_calloc__((ulong)p,0x28,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/pset_io.c"
                                ,0x50);
    *n_pset = p;
    fseek(__stream,0,0);
    uVar1 = acmod_set_n_ci(acmod_set);
    lc = 0;
    _j = lineiter_start((FILE *)__stream);
    while (_j != (lineiter_t *)0x0) {
      iVar2 = str2words(_j->buf,(char **)0x0,0);
      uVar3 = iVar2 - 1;
      *(uint *)(file_name_local + (ulong)lc * 0x28 + 0x10) = uVar3;
      if (uVar3 == 0) {
        string_trim(_j->buf,STRING_BOTH);
        pcVar7 = strdup(_j->buf);
        *(char **)(file_name_local + (ulong)lc * 0x28) = pcVar7;
        pvVar6 = __ckd_calloc__(4,4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/pset_io.c"
                                ,0x6f);
        *(void **)(file_name_local + (ulong)lc * 0x28 + 0x20) = pvVar6;
        iVar5 = strcmp(*(char **)(file_name_local + (ulong)lc * 0x28),"WDBNDRY_B");
        if (iVar5 == 0) {
          **(undefined4 **)(file_name_local + (ulong)lc * 0x28 + 0x20) = 1;
        }
        else {
          iVar5 = strcmp(*(char **)(file_name_local + (ulong)lc * 0x28),"WDBNDRY_E");
          if (iVar5 == 0) {
            *(undefined4 *)(*(long *)(file_name_local + (ulong)lc * 0x28 + 0x20) + 4) = 1;
          }
          else {
            iVar5 = strcmp(*(char **)(file_name_local + (ulong)lc * 0x28),"WDBNDRY_S");
            if (iVar5 == 0) {
              *(undefined4 *)(*(long *)(file_name_local + (ulong)lc * 0x28 + 0x20) + 8) = 1;
            }
            else {
              iVar5 = strcmp(*(char **)(file_name_local + (ulong)lc * 0x28),"WDBNDRY_I");
              if (iVar5 != 0) {
                err_msg(ERR_FATAL,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/pset_io.c"
                        ,0x7e,"Unknown null question %s\n",
                        *(undefined8 *)(file_name_local + (ulong)lc * 0x28));
                exit(1);
              }
              *(undefined4 *)(*(long *)(file_name_local + (ulong)lc * 0x28 + 0x20) + 0xc) = 1;
            }
          }
        }
        pcVar7 = file_name_local + (ulong)lc * 0x28 + 8;
        pcVar7[0] = '\0';
        pcVar7[1] = '\0';
        pcVar7[2] = '\0';
        pcVar7[3] = '\0';
        pcVar7[4] = '\0';
        pcVar7[5] = '\0';
        pcVar7[6] = '\0';
        pcVar7[7] = '\0';
      }
      else {
        pvVar6 = __ckd_calloc__((ulong)uVar3,4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/pset_io.c"
                                ,0x5e);
        *(void **)(file_name_local + (ulong)lc * 0x28 + 8) = pvVar6;
        pvVar6 = __ckd_calloc__((ulong)uVar1,4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/pset_io.c"
                                ,0x5f);
        *(void **)(file_name_local + (ulong)lc * 0x28 + 0x18) = pvVar6;
        pcVar7 = strtok(_j->buf," \t");
        pcVar7 = strdup(pcVar7);
        *(char **)(file_name_local + (ulong)lc * 0x28) = pcVar7;
        for (n_phone = 0; n_phone < uVar3; n_phone = n_phone + 1) {
          pcVar7 = strtok((char *)0x0," \t");
          aVar4 = acmod_set_name2id(acmod_set,pcVar7);
          if (aVar4 == 0xffffffff) {
            err_msg(ERR_WARN,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/pset_io.c"
                    ,0x65,"Unknown phone %s in set %s\n",pcVar7,
                    *(undefined8 *)(file_name_local + (ulong)lc * 0x28));
          }
          else {
            *(acmod_id_t *)(*(long *)(file_name_local + (ulong)lc * 0x28 + 8) + (ulong)n_phone * 4)
                 = aVar4;
            *(undefined4 *)(*(long *)(file_name_local + (ulong)lc * 0x28 + 0x18) + (ulong)aVar4 * 4)
                 = 1;
          }
        }
      }
      _j = lineiter_next(_j);
      lc = lc + 1;
    }
  }
  return (pset_t *)file_name_local;
}

Assistant:

pset_t *
read_pset_file(const char *file_name,
	       acmod_set_t *acmod_set,
	       uint32 *n_pset)
{
    FILE *fp;
    lineiter_t *li;
    uint32 i, j, lc, n_phone, p;
    pset_t *out;
    uint32 n_ci;

    fp = fopen(file_name, "r");

    if (fp == NULL) {
	E_ERROR_SYSTEM("Unable to open %s", file_name);
	return NULL;
    }

    for (lc = 0, li = lineiter_start(fp); li; li = lineiter_next(li), lc++);

    out = ckd_calloc(lc, sizeof(pset_t));
    *n_pset = lc;

    fseek(fp, 0L, SEEK_SET);

    n_ci = acmod_set_n_ci(acmod_set);

    for (i = 0, li = lineiter_start(fp); li; li = lineiter_next(li), i++) {

	n_phone = str2words(li->buf, NULL, 0) - 1;

	out[i].n_phone = n_phone;

	if (n_phone > 0) {
	    out[i].phone  = ckd_calloc(n_phone, sizeof(acmod_id_t));
	    out[i].member = ckd_calloc(n_ci, sizeof(uint32));
	    out[i].name = strdup(strtok(li->buf, " \t"));
	    for (j = 0; j < n_phone; j++) {
		char *phone = strtok(NULL, " \t");
		p = acmod_set_name2id(acmod_set, phone);
		if (p == NO_ACMOD) {
		    E_WARN("Unknown phone %s in set %s\n", phone, out[i].name);
		    continue;
		}
		out[i].phone[j] = (acmod_id_t)p;
		out[i].member[p] = TRUE;
	    }
	}
	else {
	    string_trim(li->buf, STRING_BOTH);
	    out[i].name = strdup(li->buf);
	    out[i].posn = ckd_calloc(N_WORD_POSN, sizeof(uint32));

	    if (strcmp(out[i].name, "WDBNDRY_B") == 0) {
		out[i].posn[(int)WORD_POSN_BEGIN] = TRUE;
	    }
	    else if (strcmp(out[i].name, "WDBNDRY_E") == 0) {
		out[i].posn[(int)WORD_POSN_END] = TRUE;
	    }
	    else if (strcmp(out[i].name, "WDBNDRY_S") == 0) {
		out[i].posn[(int)WORD_POSN_SINGLE] = TRUE;
	    }
	    else if (strcmp(out[i].name, "WDBNDRY_I") == 0) {
		out[i].posn[(int)WORD_POSN_INTERNAL] = TRUE;
	    }
	    else {
		E_FATAL("Unknown null question %s\n", out[i].name);
	    }

	    out[i].phone = NULL;
	}
    }

    return out;
}